

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderRenderingPointsCase::getRenderTargetSize
          (GeometryShaderRenderingPointsCase *this,uint n_instances,uint *out_width,uint *out_height
          )

{
  int iVar1;
  uint uVar2;
  TestError *this_00;
  
  iVar1 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar1 == 0) {
    *out_width = 0x26;
    uVar2 = n_instances * 5 - 2;
  }
  else if (iVar1 == 2) {
    *out_width = 0x30;
    uVar2 = n_instances * 6;
  }
  else {
    if (iVar1 != 1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported shader output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x59b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    *out_width = 0x38;
    uVar2 = n_instances * 7;
  }
  *out_height = uVar2;
  return;
}

Assistant:

void GeometryShaderRenderingPointsCase::getRenderTargetSize(unsigned int n_instances, unsigned int* out_width,
															unsigned int* out_height)
{
	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		*out_width  = 56;			   /* as per test spec */
		*out_height = 7 * n_instances; /* as per test spec */

		break;
	}

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		*out_width  = 38;									   /* as per test spec */
		*out_height = 3 * n_instances + 2 * (n_instances - 1); /* as per test spec */

		break;
	}

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		*out_width  = 48;			   /* as per test spec */
		*out_height = 6 * n_instances; /* as per test spec */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type");
	}
	} /* switch (m_output_type) */
}